

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_init.c
# Opt level: O2

void flush_dpb_buf_slot(H264_DecCtx_t *p_Dec)

{
  RK_S32 index;
  h264_dpb_mark_t *phVar1;
  long lVar2;
  MppFrame mframe;
  
  for (lVar2 = 0; lVar2 != 0x460; lVar2 = lVar2 + 0x20) {
    phVar1 = p_Dec->dpb_mark;
    if (((phVar1 != (h264_dpb_mark_t *)0x0) && ((&phVar1->out_flag)[lVar2] != '\0')) &&
       (index = *(RK_S32 *)((long)&phVar1->slot_idx + lVar2), -1 < index)) {
      mframe = (MppFrame)0x0;
      mpp_buf_slot_get_prop(p_Dec->frame_slots,index,SLOT_FRAME_PTR,&mframe);
      if (mframe != (MppFrame)0x0) {
        if ((h264d_debug._1_1_ & 0x20) != 0) {
          _mpp_log_l(4,"h264d_init","[DPB_BUF_FLUSH] slot_idx=%d, top_used=%d, bot_used=%d",
                     (char *)0x0,(ulong)*(uint *)((long)&phVar1->slot_idx + lVar2),
                     (ulong)(&phVar1->top_used)[lVar2],(uint)(&phVar1->bot_used)[lVar2]);
        }
        mpp_frame_set_discard(mframe,1);
        mpp_buf_slot_set_flag
                  (p_Dec->frame_slots,*(RK_S32 *)((long)&phVar1->slot_idx + lVar2),SLOT_QUEUE_USE);
        mpp_buf_slot_enqueue
                  (p_Dec->frame_slots,*(RK_S32 *)((long)&phVar1->slot_idx + lVar2),QUEUE_DISPLAY);
        mpp_buf_slot_clr_flag
                  (p_Dec->frame_slots,*(RK_S32 *)((long)&phVar1->slot_idx + lVar2),SLOT_CODEC_USE);
        p_Dec->last_frame_slot_idx = *(RK_S32 *)((long)&phVar1->slot_idx + lVar2);
      }
    }
    reset_dpb_mark((H264_DpbMark_t *)(&phVar1->top_used + lVar2));
  }
  return;
}

Assistant:

void flush_dpb_buf_slot(H264_DecCtx_t *p_Dec)
{
    RK_U32 i = 0;
    H264_DpbMark_t *p_mark = NULL;

    for (i = 0; i < MAX_MARK_SIZE; i++) {
        p_mark = &p_Dec->dpb_mark[i];
        if (p_mark && p_mark->out_flag && (p_mark->slot_idx >= 0)) {
            MppFrame mframe = NULL;
            mpp_buf_slot_get_prop(p_Dec->frame_slots, p_mark->slot_idx, SLOT_FRAME_PTR, &mframe);
            if (mframe) {
                H264D_DBG(H264D_DBG_SLOT_FLUSH, "[DPB_BUF_FLUSH] slot_idx=%d, top_used=%d, bot_used=%d",
                          p_mark->slot_idx, p_mark->top_used, p_mark->bot_used);
                mpp_frame_set_discard(mframe, 1);
                mpp_buf_slot_set_flag(p_Dec->frame_slots, p_mark->slot_idx, SLOT_QUEUE_USE);
                mpp_buf_slot_enqueue(p_Dec->frame_slots, p_mark->slot_idx, QUEUE_DISPLAY);
                mpp_buf_slot_clr_flag(p_Dec->frame_slots, p_mark->slot_idx, SLOT_CODEC_USE);
                p_Dec->last_frame_slot_idx = p_mark->slot_idx;
            }
        }
        reset_dpb_mark(p_mark);
    }
}